

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chebyshev1.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  float fVar1;
  int i_2;
  double norm_signal_frequency;
  double norm_cutoff_frequency;
  float pass_ripple_db2;
  LowPass<8,_Iir::DirectFormII> lp_cheby1;
  float a_1;
  int i_1;
  float frequency_width;
  float center_frequency;
  BandStop<4,_Iir::DirectFormI> bs;
  float a;
  int i;
  double b;
  float cutoff_frequency;
  float samplingrate;
  HighPass<3,_Iir::DirectFormII> f;
  int order;
  char *in_stack_fffffffffffff738;
  char *t;
  undefined4 in_stack_fffffffffffff740;
  int in_stack_fffffffffffff744;
  int b_00;
  double in_stack_fffffffffffff748;
  double dVar2;
  CascadeStages<4,_Iir::DirectFormI> *in_stack_fffffffffffff750;
  undefined4 in_stack_fffffffffffff768;
  float in_stack_fffffffffffff76c;
  CascadeStages<4,_Iir::DirectFormI> *in_stack_fffffffffffff770;
  char acStack_840 [768];
  undefined4 local_540;
  int local_53c;
  undefined4 local_538;
  undefined4 local_534;
  undefined4 local_210;
  int local_20c;
  double local_208;
  undefined4 local_200;
  undefined4 local_1fc;
  undefined4 local_14;
  undefined4 local_4;
  
  local_4 = 0;
  local_14 = 3;
  Iir::ChebyshevI::HighPass<3,_Iir::DirectFormII>::HighPass
            ((HighPass<3,_Iir::DirectFormII> *)0x102469);
  local_1fc = 0x447a0000;
  local_200 = 0x40a00000;
  Iir::ChebyshevI::HighPass<3,_Iir::DirectFormII>::setup
            ((HighPass<3,_Iir::DirectFormII> *)in_stack_fffffffffffff750,in_stack_fffffffffffff748,
             (double)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
             (double)in_stack_fffffffffffff738);
  for (local_20c = 0; local_20c < 100000; local_20c = local_20c + 1) {
    local_210 = 0;
    if (local_20c == 10) {
      local_210 = 0x3f800000;
    }
    fVar1 = Iir::CascadeStages<2,_Iir::DirectFormII>::filter<float>
                      ((CascadeStages<2,_Iir::DirectFormII> *)in_stack_fffffffffffff770,
                       in_stack_fffffffffffff76c);
    local_208 = (double)fVar1;
    std::isnan(local_208);
    assert_print(in_stack_fffffffffffff744,in_stack_fffffffffffff738);
  }
  assert_print(in_stack_fffffffffffff744,in_stack_fffffffffffff738);
  Iir::ChebyshevI::BandStop<4,_Iir::DirectFormI>::BandStop
            ((BandStop<4,_Iir::DirectFormI> *)0x102592);
  local_534 = 0x42480000;
  local_538 = 0x40a00000;
  Iir::ChebyshevI::BandStop<4,_Iir::DirectFormI>::setup
            ((BandStop<4,_Iir::DirectFormI> *)in_stack_fffffffffffff750,in_stack_fffffffffffff748,
             (double)CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
             (double)in_stack_fffffffffffff738,5.22856333221354e-318);
  Iir::CascadeStages<4,_Iir::DirectFormI>::reset(in_stack_fffffffffffff750);
  for (local_53c = 0; local_53c < 100000; local_53c = local_53c + 1) {
    local_540 = 0;
    if (local_53c == 10) {
      local_540 = 0x3f800000;
    }
    fVar1 = Iir::CascadeStages<4,_Iir::DirectFormI>::filter<float>
                      (in_stack_fffffffffffff770,in_stack_fffffffffffff76c);
    local_208 = (double)fVar1;
    std::isnan(local_208);
    assert_print(in_stack_fffffffffffff744,in_stack_fffffffffffff738);
  }
  assert_print(in_stack_fffffffffffff744,in_stack_fffffffffffff738);
  Iir::ChebyshevI::LowPass<8,_Iir::DirectFormII>::LowPass((LowPass<8,_Iir::DirectFormII> *)0x1026d1)
  ;
  Iir::ChebyshevI::LowPass<8,_Iir::DirectFormII>::setupN
            ((LowPass<8,_Iir::DirectFormII> *)
             CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
             (double)in_stack_fffffffffffff738,5.23000600389939e-318);
  dVar2 = 0.097;
  for (b_00 = 0; b_00 < 10000; b_00 = b_00 + 1) {
    t = acStack_840;
    sin(dVar2 * 6.283185307179586 * (double)b_00);
    local_208 = Iir::CascadeStages<4,_Iir::DirectFormII>::filter<double>
                          ((CascadeStages<4,_Iir::DirectFormII> *)in_stack_fffffffffffff770,
                           (double)CONCAT44(in_stack_fffffffffffff76c,in_stack_fffffffffffff768));
    local_208 = ABS(local_208);
    if (5000 < b_00) {
      assert_print(b_00,t);
    }
  }
  return 0;
}

Assistant:

int main(int, char**)
{
	const int order = 3;
	Iir::ChebyshevI::HighPass<order> f;
	const float samplingrate = 1000; // Hz
	const float cutoff_frequency = 5; // Hz
	f.setup(samplingrate, cutoff_frequency, 1);
	double b;
	for (int i = 0; i < 100000; i++)
	{
		float a = 0;
		if (i == 10) a = 1;
		b = f.filter(a);
		assert_print(!isnan(b), "Highpass output is NAN\n");
	}
	//fprintf(stderr,"%e\n",b);
	assert_print(fabs(b) < 1E-15, "Highpass value for t->inf to high!");

	Iir::ChebyshevI::BandStop<4, Iir::DirectFormI> bs;
	const float center_frequency = 50;
	const float frequency_width = 5;
	bs.setup(samplingrate, center_frequency, frequency_width, 1);
	bs.reset();
	for (int i = 0; i < 100000; i++)
	{
		float a = 0;
		if (i == 10) a = 1;
		b = bs.filter(a);
		assert_print(!isnan(b), "Bandstop output is NAN\n");
		//fprintf(stderr,"%e\n",b);
	}
	//fprintf(stderr,"%e\n",b);
	assert_print(fabs(b) < 1E-15, "Bandstop value for t->inf to high!");

	Iir::ChebyshevI::LowPass<8> lp_cheby1;
	const float pass_ripple_db2 = 1; // dB
	double norm_cutoff_frequency = 0.01;
	lp_cheby1.setupN(norm_cutoff_frequency,
		pass_ripple_db2);
	double norm_signal_frequency = 0.097;
	for (int i = 0; i < 10000; i++)
	{
		b = fabs(lp_cheby1.filter(sin(2 * M_PI*norm_signal_frequency*i)));
		if (i > 5000) {
			assert_print(b < 1E-5, "Lowpass not removing a sine.\n");
		}
	}

	return 0;


}